

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.cpp
# Opt level: O0

void __thiscall RNG_Advance_Test::RNG_Advance_Test(RNG_Advance_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__RNG_Advance_Test_03956520;
  return;
}

Assistant:

TEST(RNG, Advance) {
    // Note: must use float not Float, since doubles consume two 32-bit
    // values from the stream, so the advance tests (as written)
    // consequently fail.
    RNG rng;
    rng.SetSequence(1234, 6502);
    std::vector<float> v;
    for (int i = 0; i < 1000; ++i)
        v.push_back(rng.Uniform<float>());

    rng.SetSequence(1234, 6502);
    rng.Advance(16);
    EXPECT_EQ(rng.Uniform<float>(), v[16]);

    for (int i = v.size() - 1; i >= 0; --i) {
        rng.SetSequence(1234, 6502);
        rng.Advance(i);
        EXPECT_EQ(rng.Uniform<float>(), v[i]);
    }

    // Switch to another sequence
    rng.SetSequence(32);
    rng.Uniform<float>();

    // Go back and check one last time
    for (int i : {5, 998, 552, 37, 16}) {
        rng.SetSequence(1234, 6502);
        rng.Advance(i);
        EXPECT_EQ(rng.Uniform<float>(), v[i]);
    }
}